

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Gia_Man_t * Llb_ReachableStatesGia(Gia_Man_t *p)

{
  Aig_Man_t *pAig_00;
  Aig_Man_t *p_00;
  Gia_Man_t *pGVar1;
  Aig_Man_t *pReached;
  Aig_Man_t *pAig;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pAig_00 = Gia_ManToAigSimple(p);
  p_00 = Llb_ReachableStates(pAig_00);
  Aig_ManStop(pAig_00);
  pGVar1 = Gia_ManFromAigSimple(p_00);
  Aig_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Llb_ReachableStatesGia( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Man_t * pAig, * pReached;
    pAig = Gia_ManToAigSimple( p );
    pReached = Llb_ReachableStates( pAig );
    Aig_ManStop( pAig );
    pNew = Gia_ManFromAigSimple( pReached );
    Aig_ManStop( pReached );
    return pNew;
}